

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::WriteTargetHelp(cmGlobalNinjaGenerator *this,ostream *os)

{
  type os_00;
  allocator<char> local_3a1;
  string local_3a0;
  string local_380;
  allocator<char> local_359;
  string local_358;
  undefined1 local_338 [8];
  cmNinjaBuild build;
  string local_1e8;
  cmAlphaNum local_1c8;
  string local_198;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  cmNinjaRule rule;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  rule._288_8_ = os;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"HELP",&local_161);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  NinjaCmd_abi_cxx11_(&local_1e8,this);
  cmAlphaNum::cmAlphaNum(&local_1c8,&local_1e8);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&build.RspFile.field_2 + 8)," -t targets");
  cmStrCat<>(&local_198,&local_1c8,(cmAlphaNum *)((long)&build.RspFile.field_2 + 8));
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"All primary targets available:");
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),
             "Rule for printing all primary targets available.");
  os_00 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
          operator*(&this->RulesFileStream);
  WriteRule((ostream *)os_00,(cmNinjaRule *)local_140);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"HELP",&local_359);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_338,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  std::__cxx11::string::operator=((string *)local_338,"Print all primary targets available.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"help",&local_3a1);
  NinjaOutputPath(&local_380,this,&local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&build.Rule.field_2 + 8),&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  WriteBuild(this,(ostream *)rule._288_8_,(cmNinjaBuild *)local_338,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_338);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetHelp(std::ostream& os)
{
  {
    cmNinjaRule rule("HELP");
    rule.Command = cmStrCat(this->NinjaCmd(), " -t targets");
    rule.Description = "All primary targets available:";
    rule.Comment = "Rule for printing all primary targets available.";
    WriteRule(*this->RulesFileStream, rule);
  }
  {
    cmNinjaBuild build("HELP");
    build.Comment = "Print all primary targets available.";
    build.Outputs.push_back(this->NinjaOutputPath("help"));
    this->WriteBuild(os, build);
  }
}